

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corealloc.h
# Opt level: O0

void __thiscall
snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
dealloc_remote_slow<snmalloc::CheckInitPthread>
          (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this,
          PagemapEntry *entry,Alloc<void> p)

{
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *pTVar1;
  ulong uVar2;
  unsigned_long uVar3;
  reference pvVar4;
  ulong uVar5;
  enable_if_t<_false,_size_t> eVar6;
  reference this_00;
  conditional_t<Config::Options_IsQueueInline,_RemoteAllocator,_RemoteAllocator_*> *this_01;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *in_RDX;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *pRVar7;
  Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *in_RSI;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *in_RDI;
  undefined8 *in_FS_OFFSET;
  bool sent_something;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  r;
  size_t szix;
  size_t ix_1;
  size_t ix_way_1;
  size_t victim_size;
  size_t victim_ix;
  size_t ix;
  size_t ix_way;
  size_t ix_set;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *entry_1;
  CapPtr<snmalloc::BatchedRemoteMessage,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
  rmsg;
  size_type in_stack_fffffffffffffd38;
  FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
  *in_stack_fffffffffffffd40;
  address_t in_stack_fffffffffffffd48;
  CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
  in_stack_fffffffffffffd50;
  Alloc<RemoteMessage> in_stack_fffffffffffffd58;
  Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *this_02;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  in_stack_fffffffffffffd60;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  n;
  address_t in_stack_fffffffffffffda0;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *key;
  undefined1 local_230 [8];
  undefined1 *local_228;
  undefined1 local_220 [40];
  undefined1 *local_1f8;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_1e8;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *local_1d0;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_1c8;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_1b8;
  LocalEntropy *local_1b0;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *id;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *pRVar8;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  ulong local_148;
  LocalEntropy *local_138;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_130;
  RemoteDeallocCacheBatchingImpl<snmalloc::StandardConfigClientMeta<>_> *local_128;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *local_120;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_118;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_110;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_108;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_100;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_f8;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_f0;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_e8;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_e0;
  RemoteDeallocCacheBatchingImpl<snmalloc::StandardConfigClientMeta<>_> *local_d8;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_d0;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_c8;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_c0;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_b8;
  LocalEntropy **local_b0;
  BatchedRemoteMessage *local_a8;
  BatchedRemoteMessage *local_a0;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *local_98
  ;
  BatchedRemoteMessage *local_90;
  ulong local_88;
  RemoteDeallocCacheBatchingImpl<snmalloc::StandardConfigClientMeta<>_> *local_80;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *local_78;
  BatchedRemoteMessage *local_70;
  BatchedRemoteMessage *local_68;
  BatchedRemoteMessage *local_60;
  BatchedRemoteMessage **local_58;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *local_50
  ;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *local_48
  ;
  ulong local_40;
  value_type_conflict local_38;
  BatchedRemoteMessage *local_30;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_28;
  ulong local_20;
  RemoteDeallocCacheBatchingImpl<snmalloc::StandardConfigClientMeta<>_> *local_18;
  value_type_conflict local_10;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_8;
  
  local_228 = local_230;
  if (*(Alloc **)*in_FS_OFFSET == &ThreadAlloc::default_alloc) {
    ThreadAlloc::CheckInitBase<snmalloc::CheckInitPthread>::
    check_init_slow<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::dealloc_remote_slow<snmalloc::CheckInitPthread>(snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>const&,snmalloc::CapPtr<void,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>>)::_lambda(snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,void*)_1_,void*>
              (in_RDX);
  }
  else {
    local_1f8 = local_220;
    pRVar7 = &in_RDI->remote_dealloc_cache;
    local_1e8 = (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                 *)((ulong)(in_RSI->head)._M_elems[0] & 0xfffffffffffffffe);
    local_1b0 = &in_RDI->entropy;
    key = in_RDI;
    id = local_1e8;
    pRVar8 = pRVar7;
    local_1c8 = (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                 *)freelist::Object::
                   make<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
                             (in_stack_fffffffffffffd50);
    this_02 = (Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
               *)&(in_RDI->remote_dealloc_cache).batching;
    local_138 = local_1b0;
    uVar2 = (ulong)id >> 3;
    local_1d0 = pRVar7;
    local_1b8 = local_1c8;
    local_130 = id;
    local_128 = (RemoteDeallocCacheBatchingImpl<snmalloc::StandardConfigClientMeta<>_> *)this_02;
    local_120 = pRVar7;
    local_118 = local_1c8;
    local_e0 = id;
    local_d8 = (RemoteDeallocCacheBatchingImpl<snmalloc::StandardConfigClientMeta<>_> *)this_02;
    local_d0 = id;
    local_c8 = id;
    local_c0 = id;
    uVar3 = bits::mask_bits<unsigned_long,unsigned_long>(0x12e254);
    uVar2 = uVar2 * 0x7efb352d >> 0x10 & uVar3;
    for (local_148 = 0; pTVar1 = local_130, local_148 < 2; local_148 = local_148 + 1) {
      local_b8 = local_130;
      pvVar4 = std::array<unsigned_long,_16UL>::operator[]
                         ((array<unsigned_long,_16UL> *)in_stack_fffffffffffffd40,
                          in_stack_fffffffffffffd38);
      if (pTVar1 == (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                     *)*pvVar4) {
        std::
        array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
        ::operator[]((array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
                      *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        local_108 = local_130;
        local_f0 = local_130;
        local_100 = local_130;
        freelist::
        Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
        ::add<false>((Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                      *)in_stack_fffffffffffffd58.unsafe_capptr,in_stack_fffffffffffffd60,
                     (FreeListKey *)in_stack_fffffffffffffd50.unsafe_capptr,
                     in_stack_fffffffffffffd48);
        local_b0 = &local_138;
        goto LAB_0012e789;
      }
    }
    local_168 = 0;
    local_160 = uVar2;
    for (local_170 = 0; uVar5 = local_160, local_170 < 2; local_170 = local_170 + 1) {
      uVar5 = uVar2 + local_170;
      pvVar4 = std::array<unsigned_long,_16UL>::operator[]
                         ((array<unsigned_long,_16UL> *)in_stack_fffffffffffffd40,
                          in_stack_fffffffffffffd38);
      if (*pvVar4 == 0) break;
      std::
      array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
      ::operator[]((array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
                    *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      eVar6 = freelist::
              Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
              ::extract_segment_length<false>
                        ((Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                          *)0x12e41e);
      if (local_168 < eVar6) {
        local_168 = eVar6;
        local_160 = uVar5;
      }
    }
    local_160 = uVar5;
    pvVar4 = std::array<unsigned_long,_16UL>::operator[]
                       ((array<unsigned_long,_16UL> *)in_stack_fffffffffffffd40,
                        in_stack_fffffffffffffd38);
    if (*pvVar4 != 0) {
      local_78 = local_120;
      local_88 = local_160;
      local_80 = (RemoteDeallocCacheBatchingImpl<snmalloc::StandardConfigClientMeta<>_> *)this_02;
      std::
      array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
      ::operator[]((array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
                    *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      pvVar4 = std::array<unsigned_long,_16UL>::operator[]
                         ((array<unsigned_long,_16UL> *)in_stack_fffffffffffffd40,
                          in_stack_fffffffffffffd38);
      local_38 = *pvVar4;
      local_a0 = (BatchedRemoteMessage *)
                 BatchedRemoteMessage::mk_from_freelist_builder
                           (in_RSI,(FreeListKey *)key,in_stack_fffffffffffffda0);
      local_58 = &local_68;
      local_90 = local_a0;
      local_70 = local_a0;
      local_68 = local_a0;
      local_60 = local_a0;
      local_30 = local_a0;
      local_98 = FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
                 ::get<false>(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      local_40 = (local_98->
                 super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                 ).super_MetaEntryBase.remote_and_sizeclass;
      local_50 = local_98;
      local_48 = local_98;
      RemoteAllocator::trunc_id((RemoteAllocator *)(local_40 & 0xffffffffffffff80));
      local_a8 = local_90;
      RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
      dealloc<9216UL>::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffd50.unsafe_capptr,
                 in_stack_fffffffffffffd48,in_stack_fffffffffffffd58);
      pvVar4 = std::array<unsigned_long,_16UL>::operator[]
                         ((array<unsigned_long,_16UL> *)in_stack_fffffffffffffd40,
                          in_stack_fffffffffffffd38);
      *pvVar4 = 0;
    }
    local_20 = local_160;
    local_28 = local_130;
    local_18 = (RemoteDeallocCacheBatchingImpl<snmalloc::StandardConfigClientMeta<>_> *)this_02;
    this_00 = std::
              array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
              ::operator[]((array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
                            *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    pvVar4 = std::array<unsigned_long,_16UL>::operator[]
                       ((array<unsigned_long,_16UL> *)in_stack_fffffffffffffd40,
                        in_stack_fffffffffffffd38);
    local_10 = *pvVar4;
    freelist::
    Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
    ::init(this_00,(EVP_PKEY_CTX *)0x0);
    local_8 = local_28;
    n.unsafe_capptr = local_28;
    pvVar4 = std::array<unsigned_long,_16UL>::operator[]
                       ((array<unsigned_long,_16UL> *)in_stack_fffffffffffffd40,
                        in_stack_fffffffffffffd38);
    *pvVar4 = (value_type_conflict)n.unsafe_capptr;
    std::
    array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
    ::operator[]((array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
                  *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    local_110 = local_130;
    local_e8 = local_130;
    local_f8 = local_130;
    freelist::
    Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
    ::add<false>(this_02,n,(FreeListKey *)this_00,in_stack_fffffffffffffd48);
LAB_0012e789:
    backend_state_ptr(in_RDI);
    this_01 = public_state(in_RDI);
    RemoteAllocator::trunc_id(this_01);
    RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::
    post<9216ul>(in_RDX,(LocalState *)pRVar8,(alloc_id_t)id);
  }
  return;
}

Assistant:

SNMALLOC_SLOW_PATH void
    dealloc_remote_slow(const PagemapEntry& entry, capptr::Alloc<void> p)
    {
      CheckInit::check_init(
        [this, &entry, p]() SNMALLOC_FAST_PATH_LAMBDA {
#ifdef SNMALLOC_TRACING
          message<1024>(
            "Remote dealloc post {} ({}, {})",
            p.unsafe_ptr(),
            sizeclass_full_to_size(entry.get_sizeclass()),
            address_cast(entry.get_slab_metadata()));
#endif
          remote_dealloc_cache.template dealloc<sizeof(Allocator)>(
            entry.get_slab_metadata(), p, &entropy);

          post();
        },
        [](Allocator* a, void* p) {
          // Recheck what kind of dealloc we should do in case the allocator
          // we get from lazy_init is the originating allocator.
          a->dealloc(p); // TODO don't double count statistics
        },
        p.unsafe_ptr());
    }